

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::toSdf(Image *__return_storage_ptr__,Mesh *_mesh,float _paddingPct,int _resolution)

{
  __type_conflict _Var1;
  bool bVar2;
  int __x;
  int iVar3;
  int iVar4;
  size_t _width;
  float fVar5;
  vec3 vVar6;
  thread *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Image *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  float local_1ec;
  int local_1e8;
  vec<3,_float,_(glm::qualifier)0> local_1e4;
  float local_1d8;
  thread local_1d0;
  thread t;
  int end_layer;
  int start_layer;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int layersLeftOver;
  int layersPerThread;
  int nThreads;
  int image_resolution;
  int layersTotal;
  float voxel_size;
  int voxel_resolution;
  float max_dist;
  undefined1 local_168 [8];
  vec3 bdiagonal;
  BVH acc;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> tris;
  undefined1 local_c8 [8];
  Mesh mesh;
  int _resolution_local;
  float _paddingPct_local;
  Mesh *_mesh_local;
  Image *rta;
  
  mesh.m_material._0_4_ = _resolution;
  mesh.m_material._4_4_ = _paddingPct;
  Mesh::Mesh((Mesh *)local_c8,_mesh);
  center((Mesh *)local_c8);
  Mesh::getTriangles((vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)&acc.leaf,
                     (Mesh *)local_c8);
  BVH::BVH((BVH *)&bdiagonal.field_2,
           (vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)&acc.leaf,SPLIT_MIDPOINT);
  BoundingBox::square((BoundingBox *)&acc);
  vVar6 = BoundingBox::getDiagonal((BoundingBox *)&acc);
  bdiagonal.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)vVar6.field_2;
  local_168 = vVar6._0_8_;
  fVar5 = glm::length<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)local_168);
  BoundingBox::expand((BoundingBox *)&acc,fVar5 * fVar5 * mesh.m_material._4_4_);
  _Var1 = std::pow<int,int>(2,(int)mesh.m_material);
  __x = (int)_Var1;
  _Var1 = std::sqrt<int>(__x);
  Image::Image(__return_storage_ptr__);
  _width = (size_t)(__x * (int)_Var1);
  Image::allocate(__return_storage_ptr__,_width,_width,1);
  iVar3 = std::thread::hardware_concurrency();
  iVar4 = __x / iVar3;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = __x % iVar3;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start_layer);
  for (end_layer = 0; end_layer < iVar3; end_layer = end_layer + 1) {
    local_1f8 = end_layer * iVar4;
    t._M_id._M_thread._4_4_ = local_1f8 + iVar4;
    if (end_layer == iVar3 + -1) {
      t._M_id._M_thread._4_4_ =
           local_1f8 + iVar4 +
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)&bdiagonal.field_2;
    local_1f4 = t._M_id._M_thread._4_4_;
    local_1e4.field_2.z = bdiagonal.field_0.x;
    local_1e4.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_168._0_4_;
    local_1e4.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_168._4_4_;
    local_200 = __return_storage_ptr__;
    local_1f0 = __x;
    local_1ec = 1.0 / (float)__x;
    local_1e8 = (int)_Var1;
    local_1d8 = fVar5 * 0.5;
    std::thread::thread<vera::toSdf(vera::Mesh_const&,float,int)::__0,,void>
              (&local_1d0,(type *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)&start_layer,&local_1d0);
    std::thread::~thread(&local_1d0);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&start_layer);
  t_1 = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&start_layer);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t_1), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start_layer);
  BVH::~BVH((BVH *)&bdiagonal.field_2);
  std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector
            ((vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)&acc.leaf);
  Mesh::~Mesh((Mesh *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Image   toSdf(const Mesh& _mesh, float _paddingPct, int _resolution) {
    Mesh mesh = _mesh;
    center(mesh);
    std::vector<Triangle> tris = mesh.getTriangles();
    BVH acc(tris, vera::SPLIT_MIDPOINT);

    acc.square();

    glm::vec3   bdiagonal   = acc.getDiagonal();
    float       max_dist    = glm::length(bdiagonal);
    acc.expand( (max_dist*max_dist) * _paddingPct );

    int    voxel_resolution = std::pow(2, _resolution);
    float        voxel_size = 1.0/float(voxel_resolution);
    int         layersTotal = std::sqrt(voxel_resolution);
    int    image_resolution = voxel_resolution * layersTotal;

    Image rta;
    rta.allocate(image_resolution, image_resolution, 1);

    const int nThreads  = std::thread::hardware_concurrency();
    int layersPerThread = voxel_resolution / nThreads;
    int layersLeftOver  = voxel_resolution % nThreads;
    max_dist *= 0.5f;

    std::vector<std::thread> threads;
    for (int i = 0; i < nThreads; ++i) {
        int start_layer = i * layersPerThread;
        int end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&acc, &rta, start_layer, end_layer, voxel_resolution, voxel_size, layersTotal, bdiagonal, max_dist ]() {
                for (int z = start_layer; z < end_layer; z++)
                for (int y = 0; y < voxel_resolution; y++)
                for (int x = 0; x < voxel_resolution; x++) {
                    // for each voxel convert it into a point in the space containing a mesh
                    glm::vec3 p = glm::vec3(x, y, z) * voxel_size;
                    p = acc.min + p * bdiagonal;

                    glm::vec4 c = acc.getClosestRGBSignedDistance(p);
                    c.a = glm::clamp(c.a/max_dist, -1.0f, 1.0f) * 0.5 + 0.5;

                    size_t layerX = (z % layersTotal) * voxel_resolution; 
                    size_t layerY = floor(z / layersTotal) * voxel_resolution;
                    rta.setColor(rta.getIndex(layerX + x, layerY + y), c);
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return rta;
}